

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::UdpDeclarationSyntax::setChild
          (UdpDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar2;
  SyntaxNode *pSVar3;
  NamedBlockClauseSyntax *pNVar4;
  logic_error *this_00;
  Token TVar5;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 7) {
    switch(index) {
    case 0:
      pSVar3 = TokenOrSyntax::node(&child);
      pSVar2 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                         (pSVar3);
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar2->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
           (pSVar2->super_SyntaxListBase).childCount;
      sVar1 = (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
              .size_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar2->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
           data_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
      break;
    case 1:
      TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->primitive).kind = TVar5.kind;
      (this->primitive).field_0x2 = TVar5._2_1_;
      (this->primitive).numFlags = (NumericTokenFlags)TVar5.numFlags.raw;
      (this->primitive).rawLen = TVar5.rawLen;
      (this->primitive).info = TVar5.info;
      break;
    case 2:
      TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->name).kind = TVar5.kind;
      (this->name).field_0x2 = TVar5._2_1_;
      (this->name).numFlags = (NumericTokenFlags)TVar5.numFlags.raw;
      (this->name).rawLen = TVar5.rawLen;
      (this->name).info = TVar5.info;
      break;
    case 3:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p =
             (pointer)SyntaxNode::as<slang::syntax::UdpPortListSyntax>(pSVar3);
      }
      not_null<slang::syntax::UdpPortListSyntax*>::not_null<slang::syntax::UdpPortListSyntax*,void>
                ((not_null<slang::syntax::UdpPortListSyntax*> *)&local_b8,
                 (UdpPortListSyntax **)&local_d8);
      (this->portList).ptr = (UdpPortListSyntax *)local_b8._M_dataplus._M_p;
      break;
    case 4:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p = (pointer)SyntaxNode::as<slang::syntax::UdpBodySyntax>(pSVar3);
      }
      not_null<slang::syntax::UdpBodySyntax*>::not_null<slang::syntax::UdpBodySyntax*,void>
                ((not_null<slang::syntax::UdpBodySyntax*> *)&local_b8,(UdpBodySyntax **)&local_d8);
      (this->body).ptr = (UdpBodySyntax *)local_b8._M_dataplus._M_p;
      break;
    case 5:
      TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->endprimitive).kind = TVar5.kind;
      (this->endprimitive).field_0x2 = TVar5._2_1_;
      (this->endprimitive).numFlags = (NumericTokenFlags)TVar5.numFlags.raw;
      (this->endprimitive).rawLen = TVar5.rawLen;
      (this->endprimitive).info = TVar5.info;
      break;
    case 6:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        pNVar4 = (NamedBlockClauseSyntax *)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        pNVar4 = SyntaxNode::as<slang::syntax::NamedBlockClauseSyntax>(pSVar3);
      }
      this->endBlockName = pNVar4;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_58,&local_78,":");
  std::__cxx11::to_string(&local_98,0x3383);
  std::operator+(&local_38,&local_58,&local_98);
  std::operator+(&local_d8,&local_38,": ");
  std::operator+(&local_b8,&local_d8,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_b8);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void UdpDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: primitive = child.token(); return;
        case 2: name = child.token(); return;
        case 3: portList = child.node() ? &child.node()->as<UdpPortListSyntax>() : nullptr; return;
        case 4: body = child.node() ? &child.node()->as<UdpBodySyntax>() : nullptr; return;
        case 5: endprimitive = child.token(); return;
        case 6: endBlockName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}